

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test::
~TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test
          (TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockParameterTest, outputParameterWithIgnoredParameters)
{
    int param = 1;
    int retval = 2;

    mock().expectOneCall("foo").withOutputParameterReturning("bar", &param, sizeof(param)).ignoreOtherParameters();
    mock().actualCall("foo").withOutputParameter("bar", &retval).withParameter("other", 1);

    LONGS_EQUAL(param, retval);

    mock().checkExpectations();
}